

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O1

void __thiscall
UCAFL::_uc_hook_cmpcov(UCAFL *this,uint64_t cur_loc,uint64_t arg1,uint64_t arg2,uint32_t size)

{
  ulong uVar1;
  
  if (0x3f < size) {
    if (7 < cur_loc - 0xfff9) {
      uVar1 = arg1 ^ arg2;
      if (((((uVar1 >> 0x38 == 0) &&
            (this->afl_area_ptr_[cur_loc + 6 ^ this->afl_prev_loc_] =
                  this->afl_area_ptr_[cur_loc + 6 ^ this->afl_prev_loc_] + '\x01',
            uVar1 >> 0x30 == 0)) &&
           (this->afl_area_ptr_[cur_loc + 5 ^ this->afl_prev_loc_] =
                 this->afl_area_ptr_[cur_loc + 5 ^ this->afl_prev_loc_] + '\x01', uVar1 >> 0x28 == 0
           )) && ((this->afl_area_ptr_[cur_loc + 4 ^ this->afl_prev_loc_] =
                        this->afl_area_ptr_[cur_loc + 4 ^ this->afl_prev_loc_] + '\x01',
                  uVar1 >> 0x20 == 0 &&
                  (this->afl_area_ptr_[cur_loc + 3 ^ this->afl_prev_loc_] =
                        this->afl_area_ptr_[cur_loc + 3 ^ this->afl_prev_loc_] + '\x01',
                  uVar1 < 0x1000000)))) &&
         ((this->afl_area_ptr_[cur_loc + 2 ^ this->afl_prev_loc_] =
                this->afl_area_ptr_[cur_loc + 2 ^ this->afl_prev_loc_] + '\x01', uVar1 < 0x10000 &&
          (this->afl_area_ptr_[cur_loc + 1 ^ this->afl_prev_loc_] =
                this->afl_area_ptr_[cur_loc + 1 ^ this->afl_prev_loc_] + '\x01', uVar1 < 0x100)))) {
        this->afl_area_ptr_[cur_loc ^ this->afl_prev_loc_] =
             this->afl_area_ptr_[cur_loc ^ this->afl_prev_loc_] + '\x01';
      }
      return;
    }
    _uc_hook_sub_impl_64(this,cur_loc - 8,arg1,arg2);
    return;
  }
  if (size < 0x20) {
    if (cur_loc - 0xffff < 2) {
      cur_loc = cur_loc - 2;
    }
    if ((((uint)arg2 ^ (uint)arg1) & 0xff00) == 0) {
      this->afl_area_ptr_[cur_loc ^ this->afl_prev_loc_] =
           this->afl_area_ptr_[cur_loc ^ this->afl_prev_loc_] + '\x01';
      return;
    }
    return;
  }
  if (cur_loc - 0xfffd < 4) {
    _uc_hook_sub_impl_32(this,cur_loc - 4,arg1,arg2);
    return;
  }
  uVar1 = arg1 ^ arg2;
  if ((((char)(uVar1 >> 0x18) == '\0') &&
      (this->afl_area_ptr_[cur_loc + 2 ^ this->afl_prev_loc_] =
            this->afl_area_ptr_[cur_loc + 2 ^ this->afl_prev_loc_] + '\x01', (uVar1 & 0xff0000) == 0
      )) && (this->afl_area_ptr_[cur_loc + 1 ^ this->afl_prev_loc_] =
                  this->afl_area_ptr_[cur_loc + 1 ^ this->afl_prev_loc_] + '\x01',
            (uVar1 & 0xff00) == 0)) {
    this->afl_area_ptr_[cur_loc ^ this->afl_prev_loc_] =
         this->afl_area_ptr_[cur_loc ^ this->afl_prev_loc_] + '\x01';
    return;
  }
  return;
}

Assistant:

void _uc_hook_cmpcov(uint64_t cur_loc, uint64_t arg1, uint64_t arg2, uint32_t size) {
        if (size >= 64) {
            if (unlikely(MAP_SIZE - cur_loc < 8))
                cur_loc -= 8;
            this->_uc_hook_sub_impl_64(cur_loc, arg1, arg2);
        } else if (size >= 32) {
            if (unlikely(MAP_SIZE - cur_loc < 4))
                cur_loc -= 4;
            this->_uc_hook_sub_impl_32(cur_loc, arg1, arg2);
        } else {
            if (unlikely(MAP_SIZE - cur_loc < 2))
                cur_loc -= 2;
            this->_uc_hook_sub_impl_16(cur_loc, arg1, arg2);
        }
    }